

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

float __thiscall slang::SVInt::toFloat(SVInt *this)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  bitwidth_t bVar4;
  _Storage<unsigned_long,_true> _Var5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  optional<long> oVar14;
  optional<unsigned_long> oVar15;
  float local_34;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_30;
  uint local_28;
  char local_24;
  byte local_23;
  SVInt local_20;
  
  SVInt((SVInt *)&local_30,&this->super_SVIntStorage);
  if (local_23 == 1) {
    flattenUnknowns((SVInt *)&local_30);
  }
  if (local_24 == '\x01') {
    oVar14 = as<long>((SVInt *)&local_30);
    _Var5._M_value =
         oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_payload;
    if (((undefined1  [16])
         oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
LAB_0020436a:
      local_34 = (float)(long)_Var5._M_value;
      goto LAB_002044dd;
    }
  }
  else {
    oVar15 = as<unsigned_long>((SVInt *)&local_30);
    _Var5._M_value =
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    if (((undefined1  [16])
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      if ((long)_Var5._M_value < 0) {
        local_34 = (float)((ulong)(oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload
                                   .super__Optional_payload_base<unsigned_long>._M_payload._0_4_ & 1
                                  ) | _Var5._M_value >> 1);
        local_34 = local_34 + local_34;
        goto LAB_002044dd;
      }
      goto LAB_0020436a;
    }
  }
  if (local_24 == '\x01') {
    bVar3 = isNegative((SVInt *)&local_30);
    if (!bVar3) goto LAB_002043b7;
    operator-(&local_20);
    operator=((SVInt *)&local_30,&local_20);
    ~SVInt(&local_20);
    bVar3 = true;
  }
  else {
LAB_002043b7:
    bVar3 = false;
  }
  bVar4 = getActiveBits((SVInt *)&local_30);
  uVar1 = bVar4 - 1;
  uVar10 = uVar1 >> 6;
  uVar8 = 0x40;
  if ((bVar4 & 0x3f) != 0) {
    uVar8 = bVar4 & 0x3f;
  }
  aVar9.pVal = (uint64_t *)&local_30;
  if ((local_23 & 1) != 0) {
    aVar9 = local_30;
  }
  if (0x40 < local_28) {
    aVar9 = local_30;
  }
  uVar6 = ((anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(aVar9.pVal + uVar10))->val;
  cVar2 = (char)uVar8;
  if (uVar1 < 0x40 || 0x17 < uVar8) {
    if (0x18 < uVar8) {
      uVar12 = ~(-1L << (cVar2 - 0x18U & 0x3f)) & uVar6;
      bVar7 = cVar2 - 0x19;
      uVar6 = uVar6 >> (cVar2 - 0x18U & 0x3f);
      goto LAB_00204444;
    }
  }
  else {
    uVar10 = uVar10 - 1;
    bVar7 = cVar2 + 0x28U & 0x3f;
    uVar6 = ((anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(aVar9.pVal + uVar10))->val >> bVar7 |
            uVar6 << 0x40 - bVar7;
    uVar12 = ~(-1L << (cVar2 + 0x28U & 0x3f)) &
             ((anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(aVar9.pVal + uVar10))->val;
    bVar7 = cVar2 + 0x27;
LAB_00204444:
    uVar13 = 1L << (bVar7 & 0x3f);
    if (uVar13 < uVar12) {
LAB_00204452:
      uVar6 = uVar6 + 1;
    }
    else if (uVar12 == uVar13) {
      if ((uVar6 & 1) != 0) goto LAB_00204452;
      iVar11 = uVar10 + 1;
      do {
        iVar11 = iVar11 + -1;
        if (iVar11 == 0) goto LAB_00204471;
      } while (((anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(aVar9.pVal + (uVar10 - 1)))->val == 0
              );
      uVar6 = uVar6 | 1;
    }
  }
LAB_00204471:
  uVar12 = (ulong)(uVar6 == 0x1000000) + (ulong)uVar1;
  if (uVar12 < 0x80) {
    local_34 = (float)((uint)uVar6 & 0x7fffff |
                      (uint)bVar3 << 0x1f | (int)uVar12 * 0x800000 + 0x3f800000U);
  }
  else if (bVar3) {
    local_34 = -INFINITY;
  }
  else {
    local_34 = INFINITY;
  }
LAB_002044dd:
  ~SVInt((SVInt *)&local_30);
  return local_34;
}

Assistant:

float SVInt::toFloat() const {
    return toIEEE754<float, 8, 23, 127>(*this);
}